

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O3

int binstrcaseless(const_bstring b1,int pos,const_bstring b2)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  uchar *puVar5;
  __int32_t **pp_Var6;
  long lVar7;
  uchar *puVar8;
  
  if (b1 == (const_bstring)0x0) {
    return -1;
  }
  puVar8 = b1->data;
  if ((((puVar8 != (uchar *)0x0) && (uVar3 = b1->slen, b2 != (const_bstring)0x0 && -1 < (int)uVar3))
      && (puVar5 = b2->data, puVar5 != (uchar *)0x0)) && (iVar4 = b2->slen, -1 < iVar4)) {
    if (uVar3 == pos) {
      return -(uint)(iVar4 != 0) | pos;
    }
    if ((uint)pos <= uVar3) {
      if (iVar4 == 0) {
        return pos;
      }
      if (pos <= (int)(uVar3 - iVar4)) {
        if (pos == 0 && puVar8 == puVar5) {
          return 0;
        }
        puVar8 = puVar8 + pos;
        while( true ) {
          lVar7 = 0;
          while( true ) {
            bVar1 = puVar5[lVar7];
            bVar2 = puVar8[lVar7];
            if ((bVar1 != bVar2) &&
               (pp_Var6 = __ctype_tolower_loc(), (*pp_Var6)[bVar1] != (*pp_Var6)[bVar2])) break;
            lVar7 = lVar7 + 1;
            if (iVar4 <= (int)lVar7) {
              return pos;
            }
          }
          if ((int)(uVar3 - iVar4) <= pos) break;
          pos = pos + 1;
          puVar8 = puVar8 + 1;
        }
      }
    }
  }
  return -1;
}

Assistant:

int binstrcaseless (const_bstring b1, int pos, const_bstring b2) {
int j, i, l, ll;
unsigned char * d0, * d1;

	if (b1 == NULL || b1->data == NULL || b1->slen < 0 ||
	    b2 == NULL || b2->data == NULL || b2->slen < 0) return BSTR_ERR;
	if (b1->slen == pos) return (b2->slen == 0)?pos:BSTR_ERR;
	if (b1->slen < pos || pos < 0) return BSTR_ERR;
	if (b2->slen == 0) return pos;

	l = b1->slen - b2->slen + 1;

	/* No space to find such a string? */
	if (l <= pos) return BSTR_ERR;

	/* An obvious alias case */
	if (b1->data == b2->data && pos == 0) return BSTR_OK;

	i = pos;
	j = 0;

	d0 = b2->data;
	d1 = b1->data;
	ll = b2->slen;

	for (;;) {
		if (d0[j] == d1[i + j] || downcase (d0[j]) == downcase (d1[i + j])) {
			j ++;
			if (j >= ll) return i;
		} else {
			i ++;
			if (i >= l) break;
			j=0;
		}
	}

	return BSTR_ERR;
}